

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void ProcessEDSector(sector_t_conflict *sec,int recordnum)

{
  byte bVar1;
  uint uVar2;
  EDSector *pEVar3;
  long lVar4;
  short sVar5;
  short sVar6;
  double *pdVar7;
  
  pEVar3 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CheckKey
                     (&EDSectors,recordnum);
  if (pEVar3 != (EDSector *)0x0) {
    uVar2 = sec->Flags & 0x3fffff8e;
    if (pEVar3->flagsSet == false) {
      uVar2 = sec->Flags;
    }
    uVar2 = ~pEVar3->flagsRemove & (uVar2 | pEVar3->flags | pEVar3->flagsAdd);
    if (pEVar3->damageflagsSet == true) {
      uVar2 = uVar2 & 0xfffff87f;
      bVar1 = 0;
    }
    else {
      bVar1 = 2;
      if (sec->leakydamage < 0x100) {
        bVar1 = 4 < sec->leakydamage;
      }
    }
    sec->Flags = ~pEVar3->damageflagsRemove & (uVar2 | pEVar3->damageflags | pEVar3->damageflagsAdd)
    ;
    bVar1 = ~pEVar3->leakyremove & (bVar1 | pEVar3->leaky | pEVar3->leakyadd);
    sVar6 = 0x100;
    if (bVar1 == 1) {
      sVar6 = 5;
    }
    sVar5 = 0;
    if (bVar1 != 0) {
      sVar5 = sVar6;
    }
    sec->leakydamage = sVar5;
    sec->damageamount = pEVar3->damageamount;
    sec->damageinterval = (short)pEVar3->damageinterval;
    (sec->damagetype).super_FName.Index = (pEVar3->damagetype).super_FName.Index;
    sec->terrainnum[0] = pEVar3->floorterrain;
    sec->terrainnum[1] = pEVar3->ceilingterrain;
    if (pEVar3->colorSet == true) {
      uVar2 = pEVar3->color;
      sector_t::SetColor((sector_t *)sec,uVar2 >> 0x10 & 0xff,uVar2 >> 8 & 0xff,uVar2 & 0xff,0);
    }
    pdVar7 = &sec->planes[0].alpha;
    for (lVar4 = -8; lVar4 != 0; lVar4 = lVar4 + 4) {
      (((splane *)(pdVar7 + -8))->xform).xOffs = *(double *)((long)pEVar3->yoffs + lVar4 * 2);
      pdVar7[-7] = *(double *)((long)&pEVar3->angle[0].Degrees + lVar4 * 2);
      ((DAngle *)(pdVar7 + -3))->Degrees = *(double *)((long)pEVar3->portalflags + lVar4 * 2);
      *pdVar7 = *(double *)((long)pEVar3[1].xoffs + lVar4 * 2 + -0x40);
      *(uint *)(pdVar7 + -1) =
           *(uint *)(pdVar7 + -1) & 0xffffff83 | *(uint *)((long)pEVar3->Overlayalpha + lVar4);
      pdVar7 = pdVar7 + 0xb;
    }
    return;
  }
  Printf("EDF Sector record %d not found\n",recordnum);
  return;
}

Assistant:

void ProcessEDSector(sector_t *sec, int recordnum)
{
	EDSector *esec = EDSectors.CheckKey(recordnum);
	if (esec == NULL)
	{
		Printf("EDF Sector record %d not found\n", recordnum);
		return;
	}

	// In ZDoom the regular and the damage flags are part of the same flag word so we need to do some masking.
	const DWORD flagmask = SECF_SECRET | SECF_WASSECRET | SECF_FRICTION | SECF_PUSH | SECF_SILENT | SECF_SILENTMOVE;
	if (esec->flagsSet) sec->Flags = (sec->Flags & ~flagmask);
	sec->Flags = (sec->Flags | esec->flags | esec->flagsAdd) & ~esec->flagsRemove;

	BYTE leak = 0;
	if (esec->damageflagsSet) sec->Flags = (sec->Flags & ~SECF_DAMAGEFLAGS);
	else leak = sec->leakydamage >= 256 ? 2 : sec->leakydamage >= 5 ? 1 : 0;
	sec->Flags = (sec->Flags | esec->damageflags | esec->damageflagsAdd) & ~esec->damageflagsRemove;
	leak = (leak | esec->leaky | esec->leakyadd) & ~esec->leakyremove;

	// the damage properties will be unconditionally overridden by Extradata.
	sec->leakydamage = leak == 0 ? 0 : leak == 1 ? 5 : 256;
	sec->damageamount = esec->damageamount;
	sec->damageinterval = esec->damageinterval;
	sec->damagetype = esec->damagetype;

	sec->terrainnum[sector_t::floor] = esec->floorterrain;
	sec->terrainnum[sector_t::ceiling] = esec->ceilingterrain;

	if (esec->colorSet) sec->SetColor(RPART(esec->color), GPART(esec->color), BPART(esec->color), 0);

	const DWORD pflagmask = PLANEF_DISABLED | PLANEF_NORENDER | PLANEF_NOPASS | PLANEF_BLOCKSOUND | PLANEF_ADDITIVE;
	for (int i = 0; i < 2; i++)
	{
		sec->SetXOffset(i, esec->xoffs[i]);
		sec->SetYOffset(i, esec->yoffs[i]);
		sec->SetAngle(i, esec->angle[i]);
		sec->SetAlpha(i, esec->Overlayalpha[i]);
		sec->planes[i].Flags = (sec->planes[i].Flags & ~pflagmask) | esec->portalflags[i];
	}
}